

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot-file.c
# Opt level: O0

int faup_snapshot_file_unzip(char *zipfile)

{
  FILE *__stream;
  undefined4 uVar1;
  mz_uint mVar2;
  mz_bool mVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 local_500 [8];
  mz_zip_archive_file_stat file_stat;
  int i;
  mz_bool status;
  mz_zip_archive zip_archive;
  int retval;
  size_t zipfile_len;
  char *url_snapshot_file;
  char *zipfile_local;
  
  zipfile_len = 0;
  url_snapshot_file = zipfile;
  zip_archive.m_pState._4_4_ = asprintf((char **)&zipfile_len,"%s.urls",zipfile);
  if (zip_archive.m_pState._4_4_ < 0) {
    fprintf(_stderr,"Error: cannot concatenate snapshot file with zip file!\n");
    zipfile_local._4_4_ = -1;
  }
  else {
    memset(&i,0,0x70);
    file_stat.m_comment._508_4_ =
         mz_zip_reader_init_file((mz_zip_archive *)&i,(char *)zipfile_len,0);
    file_stat.m_comment[0x1f8] = '\0';
    file_stat.m_comment[0x1f9] = '\0';
    file_stat.m_comment[0x1fa] = '\0';
    file_stat.m_comment[0x1fb] = '\0';
    for (; uVar1 = file_stat.m_comment._504_4_,
        mVar2 = mz_zip_reader_get_num_files((mz_zip_archive *)&i), (int)uVar1 < (int)mVar2;
        file_stat.m_comment._504_4_ = file_stat.m_comment._504_4_ + 1) {
      mVar3 = mz_zip_reader_file_stat
                        ((mz_zip_archive *)&i,file_stat.m_comment._504_4_,
                         (mz_zip_archive_file_stat *)local_500);
      if (mVar3 == 0) {
        fprintf(_stderr,"Cannot stat the zip file!\n");
        mz_zip_reader_end((mz_zip_archive *)&i);
        return -1;
      }
      faup_utils_recursive_mkdir((char *)&file_stat.m_is_encrypted);
      file_stat.m_comment._508_4_ =
           mz_zip_reader_extract_to_file
                     ((mz_zip_archive *)&i,file_stat.m_comment._504_4_,
                      (char *)&file_stat.m_is_encrypted,0);
      __stream = _stderr;
      if (file_stat.m_comment._508_4_ == 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(__stream,"Error extracting \'%s\': %s\n",&file_stat.m_is_encrypted,pcVar5);
      }
    }
    mz_zip_reader_end((mz_zip_archive *)&i);
    free((void *)zipfile_len);
    zipfile_local._4_4_ = 0;
  }
  return zipfile_local._4_4_;
}

Assistant:

int faup_snapshot_file_unzip(char *zipfile)
{

  char *url_snapshot_file = NULL;
  size_t zipfile_len;
  int retval;

  mz_zip_archive zip_archive;
  mz_bool status;
  int i;

  retval = asprintf(&url_snapshot_file, "%s.urls", zipfile);
  if (retval < 0) {
    fprintf(stderr, "Error: cannot concatenate snapshot file with zip file!\n");
    return -1;
  }

  memset(&zip_archive, 0, sizeof(zip_archive));
  status = mz_zip_reader_init_file(&zip_archive, url_snapshot_file, 0);
  for (i = 0; i < (int)mz_zip_reader_get_num_files(&zip_archive); i++) {
    mz_zip_archive_file_stat file_stat;

    if (!mz_zip_reader_file_stat(&zip_archive, i, &file_stat)) {
      fprintf(stderr, "Cannot stat the zip file!\n");
      mz_zip_reader_end(&zip_archive);
      return -1;
    }

    faup_utils_recursive_mkdir(file_stat.m_filename);

    status = mz_zip_reader_extract_to_file(&zip_archive, i, file_stat.m_filename, 0);
    if (!status) {
      fprintf(stderr, "Error extracting '%s': %s\n", file_stat.m_filename, strerror(errno));
    }
  }

  mz_zip_reader_end(&zip_archive);

  free(url_snapshot_file);

  return 0;
}